

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O1

void __thiscall
Am_Object_Data::delete_slot(Am_Object_Data *this,Am_Slot_Data *slot,Am_Slot_Data *proto_slot)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  uint uVar3;
  ushort uVar4;
  byte bVar5;
  Am_Object_Data *pAVar6;
  
  if (proto_slot == (Am_Slot_Data *)0x0) {
    if (((slot->super_Am_Value).type != 0x1002) &&
       (pAVar6 = this->first_instance, pAVar6 != (Am_Object_Data *)0x0)) {
      AVar1 = slot->key;
      do {
        notify_change(pAVar6,AVar1,(Am_Constraint *)0x0,&slot->super_Am_Value,&Missing_Slot_Value);
        pAVar6 = pAVar6->next_instance;
      } while (pAVar6 != (Am_Object_Data *)0x0);
    }
  }
  else {
    uVar3 = *(uint *)&proto_slot->field_0x38 >> 8 & 3;
    if ((uVar3 != 0) && (uVar3 != 3)) {
      *(ushort *)&proto_slot->field_0x38 = (ushort)*(uint *)&proto_slot->field_0x38 | 1;
    }
    uVar4 = *(ushort *)&slot->field_0x38 >> 8 & 3;
    if ((short)uVar3 == 2 || uVar4 == 2) {
      *(ushort *)&slot->field_0x38 = *(ushort *)&slot->field_0x38 & 0xfffe;
      for (pAVar6 = this->first_instance; pAVar6 != (Am_Object_Data *)0x0;
          pAVar6 = pAVar6->next_instance) {
        sever_slot(pAVar6,slot);
      }
    }
    else if (((short)uVar3 == 1 && uVar4 == 1) &&
            (bVar2 = Am_Value::operator!=(&slot->super_Am_Value,&proto_slot->super_Am_Value), bVar2)
            ) {
      pAVar6 = this->first_instance;
      if (pAVar6 != (Am_Object_Data *)0x0) {
        bVar5 = 1;
        AVar1 = slot->key;
        do {
          bVar2 = notify_change(pAVar6,AVar1,(Am_Constraint *)0x0,&slot->super_Am_Value,
                                &proto_slot->super_Am_Value);
          bVar5 = bVar5 & bVar2;
          pAVar6 = pAVar6->next_instance;
        } while (pAVar6 != (Am_Object_Data *)0x0);
        if (bVar5 == 0) goto LAB_001cecd5;
      }
      proto_slot->field_0x38 = proto_slot->field_0x38 & 0xfe;
    }
  }
LAB_001cecd5:
  Am_Slot_Data::Destroy(slot);
  return;
}

Assistant:

void
Am_Object_Data::delete_slot(Am_Slot_Data *slot, Am_Slot_Data *proto_slot)
{
  Am_Value_Type type = (Am_Value_Type)slot->type;
  if (proto_slot) {
    Am_Inherit_Rule rule = (Am_Inherit_Rule)proto_slot->rule;
    if ((rule != Am_LOCAL) && (rule != Am_STATIC))
      proto_slot->flags |= BIT_IS_INHERITED;
    if ((slot->rule == Am_COPY) || (rule == Am_COPY))
      sever_copies(slot);
    else if ((slot->rule == Am_INHERIT) && (rule == Am_INHERIT)) {
#if 1 // propagate all changes
      if (*slot != *proto_slot)
#endif
        if (propagate_change(slot->key, nullptr, *slot, *proto_slot))
          proto_slot->flags &= ~BIT_IS_INHERITED;
    }
  } else if (type != Am_MISSING_SLOT)
    (void)propagate_change(slot->key, nullptr, *slot, Missing_Slot_Value);
  slot->Destroy();
}